

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeGetIntegratorStats
              (void *cvode_mem,long *nsteps,long *nfevals,long *nlinsetups,long *netfails,int *qlast
              ,int *qcur,sunrealtype *hinused,sunrealtype *hlast,sunrealtype *hcur,sunrealtype *tcur
              )

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x5ab,"CVodeGetIntegratorStats",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    *nsteps = *(long *)((long)cvode_mem + 0x358);
    *nfevals = *(long *)((long)cvode_mem + 0x360);
    *nlinsetups = *(long *)((long)cvode_mem + 0x388);
    *netfails = *(long *)((long)cvode_mem + 0x380);
    *qlast = *(int *)((long)cvode_mem + 0x428);
    *qcur = *(int *)((long)cvode_mem + 0x128);
    *hinused = *(sunrealtype *)((long)cvode_mem + 0x438);
    *hlast = *(sunrealtype *)((long)cvode_mem + 0x440);
    *hcur = *(sunrealtype *)((long)cvode_mem + 0x150);
    *tcur = *(sunrealtype *)((long)cvode_mem + 0x168);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetIntegratorStats(void* cvode_mem, long int* nsteps, long int* nfevals,
                            long int* nlinsetups, long int* netfails, int* qlast,
                            int* qcur, sunrealtype* hinused, sunrealtype* hlast,
                            sunrealtype* hcur, sunrealtype* tcur)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  *nsteps     = cv_mem->cv_nst;
  *nfevals    = cv_mem->cv_nfe;
  *nlinsetups = cv_mem->cv_nsetups;
  *netfails   = cv_mem->cv_netf;
  *qlast      = cv_mem->cv_qu;
  *qcur       = cv_mem->cv_next_q;
  *hinused    = cv_mem->cv_h0u;
  *hlast      = cv_mem->cv_hu;
  *hcur       = cv_mem->cv_next_h;
  *tcur       = cv_mem->cv_tn;

  return (CV_SUCCESS);
}